

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

void helper_msa_st_h_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,target_ulong addr)

{
  uint uVar1;
  long lVar2;
  uintptr_t unaff_retaddr;
  
  uVar1 = 3;
  if ((env->hflags >> 0x1c & 1) == 0) {
    uVar1 = env->hflags & 3;
  }
  if (0xff0 < ((uint)addr & 0xfff)) {
    helper_msa_st_h_mips64_cold_1();
  }
  uVar1 = uVar1 | 0x790;
  lVar2 = (ulong)wd * 0x10;
  helper_be_stw_mmu_mips64
            ((CPUArchState_conflict11 *)env,addr,*(uint16_t *)((env->active_fpu).fpr + wd),uVar1,
             unaff_retaddr);
  helper_be_stw_mmu_mips64
            ((CPUArchState_conflict11 *)env,addr + 2,
             *(uint16_t *)((long)(env->active_fpu).fpr + lVar2 + 2),uVar1,unaff_retaddr);
  helper_be_stw_mmu_mips64
            ((CPUArchState_conflict11 *)env,addr + 4,
             *(uint16_t *)((long)(env->active_fpu).fpr + lVar2 + 4),uVar1,unaff_retaddr);
  helper_be_stw_mmu_mips64
            ((CPUArchState_conflict11 *)env,addr + 6,
             *(uint16_t *)((long)(env->active_fpu).fpr + lVar2 + 6),uVar1,unaff_retaddr);
  helper_be_stw_mmu_mips64
            ((CPUArchState_conflict11 *)env,addr + 8,
             *(uint16_t *)((long)(env->active_fpu).fpr + lVar2 + 8),uVar1,unaff_retaddr);
  helper_be_stw_mmu_mips64
            ((CPUArchState_conflict11 *)env,addr + 10,
             *(uint16_t *)((long)(env->active_fpu).fpr + lVar2 + 10),uVar1,unaff_retaddr);
  helper_be_stw_mmu_mips64
            ((CPUArchState_conflict11 *)env,addr + 0xc,
             *(uint16_t *)((long)(env->active_fpu).fpr + lVar2 + 0xc),uVar1,unaff_retaddr);
  helper_be_stw_mmu_mips64
            ((CPUArchState_conflict11 *)env,addr + 0xe,
             *(uint16_t *)((long)(env->active_fpu).fpr + lVar2 + 0xe),uVar1,unaff_retaddr);
  return;
}

Assistant:

void helper_msa_st_h(CPUMIPSState *env, uint32_t wd,
                     target_ulong addr)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    int mmu_idx = cpu_mmu_index(env, false);

    MEMOP_IDX(DF_HALF)
    ensure_writable_pages(env, addr, mmu_idx, GETPC());
#if !defined(HOST_WORDS_BIGENDIAN)
    helper_ret_stw_mmu(env, addr + (0 << DF_HALF), pwd->h[0], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (1 << DF_HALF), pwd->h[1], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (2 << DF_HALF), pwd->h[2], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (3 << DF_HALF), pwd->h[3], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (4 << DF_HALF), pwd->h[4], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (5 << DF_HALF), pwd->h[5], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (6 << DF_HALF), pwd->h[6], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (7 << DF_HALF), pwd->h[7], oi, GETPC());
#else
    helper_ret_stw_mmu(env, addr + (3 << DF_HALF), pwd->h[0], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (2 << DF_HALF), pwd->h[1], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (1 << DF_HALF), pwd->h[2], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (0 << DF_HALF), pwd->h[3], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (7 << DF_HALF), pwd->h[4], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (6 << DF_HALF), pwd->h[5], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (5 << DF_HALF), pwd->h[6], oi, GETPC());
    helper_ret_stw_mmu(env, addr + (4 << DF_HALF), pwd->h[7], oi, GETPC());
#endif
}